

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O2

void emit_header(gif_dest_ptr dinfo,int num_colors,JSAMPARRAY colormap)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  byte bVar3;
  byte bVar4;
  code_int code;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  iVar1 = dinfo->cinfo->data_precision;
  if (0x100 < num_colors) {
    pjVar2 = dinfo->cinfo->err;
    pjVar2->msg_code = 0x413;
    (pjVar2->msg_parm).i[0] = num_colors;
    (*dinfo->cinfo->err->error_exit)((j_common_ptr)dinfo->cinfo);
  }
  bVar4 = (char)iVar1 - 8;
  uVar5 = 0xfffffff0;
  uVar10 = 0;
  do {
    uVar11 = uVar10;
    uVar10 = uVar11 + 1;
    bVar3 = (byte)uVar10 & 0x1f;
    uVar7 = 1 << bVar3;
    uVar5 = uVar5 + 0x10;
  } while ((int)uVar7 < num_colors);
  putc(0x47,(FILE *)(dinfo->pub).output_file);
  putc(0x49,(FILE *)(dinfo->pub).output_file);
  putc(0x46,(FILE *)(dinfo->pub).output_file);
  putc(0x38,(FILE *)(dinfo->pub).output_file);
  putc(0x37,(FILE *)(dinfo->pub).output_file);
  putc(0x61,(FILE *)(dinfo->pub).output_file);
  put_word(dinfo,dinfo->cinfo->output_width);
  put_word(dinfo,dinfo->cinfo->output_height);
  putc(uVar5 | 0x80 | uVar11,(FILE *)(dinfo->pub).output_file);
  uVar9 = 0;
  putc(0,(FILE *)(dinfo->pub).output_file);
  putc(0,(FILE *)(dinfo->pub).output_file);
  uVar6 = (long)(num_colors + -1) / 2 & 0xffffffff;
  uVar8 = (ulong)uVar7;
  if (1 << bVar3 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    if ((long)uVar9 < (long)num_colors) {
      if (colormap == (JSAMPARRAY)0x0) {
        put_3bytes(dinfo,(int)uVar6 / (num_colors + -1));
      }
      else {
        uVar5 = (uint)((*colormap)[uVar9] >> (bVar4 & 0x1f));
        if (dinfo->cinfo->out_color_space == JCS_RGB) {
          putc(uVar5,(FILE *)(dinfo->pub).output_file);
          putc((uint)(colormap[1][uVar9] >> (bVar4 & 0x1f)),(FILE *)(dinfo->pub).output_file);
          putc((uint)(colormap[2][uVar9] >> (bVar4 & 0x1f)),(FILE *)(dinfo->pub).output_file);
        }
        else {
          put_3bytes(dinfo,uVar5);
        }
      }
    }
    else {
      put_3bytes(dinfo,0x80 >> (bVar4 & 0x1f));
    }
    uVar6 = (ulong)((int)uVar6 + 0xff);
  }
  uVar5 = 2;
  if (2 < uVar10) {
    uVar5 = uVar10;
  }
  putc(0x2c,(FILE *)(dinfo->pub).output_file);
  put_word(dinfo,0);
  put_word(dinfo,0);
  put_word(dinfo,dinfo->cinfo->output_width);
  put_word(dinfo,dinfo->cinfo->output_height);
  putc(0,(FILE *)(dinfo->pub).output_file);
  putc(uVar5,(FILE *)(dinfo->pub).output_file);
  dinfo->init_bits = uVar5 + 1;
  dinfo->n_bits = uVar5 + 1;
  dinfo->maxcode = ~(ushort)(-2 << ((byte)uVar5 & 0x1f));
  code = (code_int)(1 << ((byte)uVar5 & 0x1f));
  dinfo->ClearCode = code;
  dinfo->EOFCode = code + 1;
  dinfo->free_code = code + 2;
  dinfo->code_counter = code + 2;
  dinfo->first_byte = 1;
  dinfo->bytesinpkt = 0;
  dinfo->cur_accum = 0;
  dinfo->cur_bits = 0;
  if (dinfo->hash_code != (code_int *)0x0) {
    memset(dinfo->hash_code,0,0x2716);
    code = dinfo->ClearCode;
  }
  output(dinfo,code);
  return;
}

Assistant:

LOCAL(void)
emit_header(gif_dest_ptr dinfo, int num_colors, JSAMPARRAY colormap)
/* Output the GIF file header, including color map */
/* If colormap == NULL, synthesize a grayscale colormap */
{
  int BitsPerPixel, ColorMapSize, InitCodeSize, FlagByte;
  int cshift = dinfo->cinfo->data_precision - 8;
  int i;

  if (num_colors > 256)
    ERREXIT1(dinfo->cinfo, JERR_TOO_MANY_COLORS, num_colors);
  /* Compute bits/pixel and related values */
  BitsPerPixel = 1;
  while (num_colors > (1 << BitsPerPixel))
    BitsPerPixel++;
  ColorMapSize = 1 << BitsPerPixel;
  if (BitsPerPixel <= 1)
    InitCodeSize = 2;
  else
    InitCodeSize = BitsPerPixel;
  /*
   * Write the GIF header.
   * Note that we generate a plain GIF87 header for maximum compatibility.
   */
  putc('G', dinfo->pub.output_file);
  putc('I', dinfo->pub.output_file);
  putc('F', dinfo->pub.output_file);
  putc('8', dinfo->pub.output_file);
  putc('7', dinfo->pub.output_file);
  putc('a', dinfo->pub.output_file);
  /* Write the Logical Screen Descriptor */
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_width);
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_height);
  FlagByte = 0x80;              /* Yes, there is a global color table */
  FlagByte |= (BitsPerPixel - 1) << 4; /* color resolution */
  FlagByte |= (BitsPerPixel - 1); /* size of global color table */
  putc(FlagByte, dinfo->pub.output_file);
  putc(0, dinfo->pub.output_file); /* Background color index */
  putc(0, dinfo->pub.output_file); /* Reserved (aspect ratio in GIF89) */
  /* Write the Global Color Map */
  /* If the color map is more than 8 bits precision, */
  /* we reduce it to 8 bits by shifting */
  for (i = 0; i < ColorMapSize; i++) {
    if (i < num_colors) {
      if (colormap != NULL) {
        if (dinfo->cinfo->out_color_space == JCS_RGB) {
          /* Normal case: RGB color map */
          putc(colormap[0][i] >> cshift, dinfo->pub.output_file);
          putc(colormap[1][i] >> cshift, dinfo->pub.output_file);
          putc(colormap[2][i] >> cshift, dinfo->pub.output_file);
        } else {
          /* Grayscale "color map": possible if quantizing grayscale image */
          put_3bytes(dinfo, colormap[0][i] >> cshift);
        }
      } else {
        /* Create a grayscale map of num_colors values, range 0..255 */
        put_3bytes(dinfo, (i * 255 + (num_colors - 1) / 2) / (num_colors - 1));
      }
    } else {
      /* fill out the map to a power of 2 */
      put_3bytes(dinfo, CENTERJSAMPLE >> cshift);
    }
  }
  /* Write image separator and Image Descriptor */
  putc(',', dinfo->pub.output_file); /* separator */
  put_word(dinfo, 0);           /* left/top offset */
  put_word(dinfo, 0);
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_width); /* image size */
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_height);
  /* flag byte: not interlaced, no local color map */
  putc(0x00, dinfo->pub.output_file);
  /* Write Initial Code Size byte */
  putc(InitCodeSize, dinfo->pub.output_file);

  /* Initialize for compression of image data */
  compress_init(dinfo, InitCodeSize + 1);
}